

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O2

Scale * icu_63::number::Scale::byDoubleAndPowerOfTen
                  (Scale *__return_storage_ptr__,double multiplicand,int32_t power)

{
  LocalPointer<icu_63::number::impl::DecNum> arbitraryToAdopt;
  undefined4 in_register_00000034;
  UErrorCode localError;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  
  localError = U_ZERO_ERROR;
  decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
       (LocalPointerBase<icu_63::number::impl::DecNum>)
       UMemory::operator_new((UMemory *)0x60,CONCAT44(in_register_00000034,power));
  if (decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr == (DecNum *)0x0) {
    localError = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    impl::DecNum::DecNum((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
    impl::DecNum::setTo((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr,
                        multiplicand,&localError);
    arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
         decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr;
    if (localError < U_ILLEGAL_ARGUMENT_ERROR) {
      decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
           (LocalPointerBase<icu_63::number::impl::DecNum>)(DecNum *)0x0;
      Scale(__return_storage_ptr__,power,
            (DecNum *)arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
      goto LAB_0025c8ba;
    }
  }
  __return_storage_ptr__->fMagnitude = 0;
  __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
  __return_storage_ptr__->fError = localError;
LAB_0025c8ba:
  LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer(&decnum);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDoubleAndPowerOfTen(double multiplicand, int32_t power) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {power, decnum.orphan()};
}